

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O0

LYS_INFORMAT get_schema_format(char *path)

{
  int iVar1;
  char *pcVar2;
  char *ptr;
  char *path_local;
  
  pcVar2 = strrchr(path,0x2e);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stdout,"Input file \"%s\" without extension - unknown format.\n",path);
    path_local._4_4_ = LYS_IN_UNKNOWN;
  }
  else {
    pcVar2 = pcVar2 + 1;
    iVar1 = strcmp(pcVar2,"yin");
    if (iVar1 == 0) {
      path_local._4_4_ = LYS_IN_YIN;
    }
    else {
      iVar1 = strcmp(pcVar2,"yang");
      if (iVar1 == 0) {
        path_local._4_4_ = LYS_IN_YANG;
      }
      else {
        fprintf(_stderr,"Input file in an unknown format \"%s\".\n",pcVar2);
        path_local._4_4_ = LYS_IN_UNKNOWN;
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

LYS_INFORMAT
get_schema_format(const char *path)
{
    char *ptr;

    if ((ptr = strrchr(path, '.')) != NULL) {
        ++ptr;
        if (!strcmp(ptr, "yin")) {
            return LYS_IN_YIN;
        } else if (!strcmp(ptr, "yang")) {
            return LYS_IN_YANG;
        } else {
            fprintf(stderr, "Input file in an unknown format \"%s\".\n", ptr);
            return LYS_IN_UNKNOWN;
        }
    } else {
        fprintf(stdout, "Input file \"%s\" without extension - unknown format.\n", path);
        return LYS_IN_UNKNOWN;
    }
}